

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find_set.cpp
# Opt level: O2

int __thiscall si9ma::UnionFindSet::find_header(UnionFindSet *this,int val)

{
  int iVar1;
  mapped_type *pmVar2;
  _Elt_pointer piVar3;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  int local_74;
  _Deque_base<int,_std::allocator<int>_> local_70;
  
  local_74 = val;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_70);
  while( true ) {
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_74);
    if (val == *pmVar2) break;
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)&local_70,&local_74);
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_74);
    local_74 = *pmVar2;
    val = local_74;
  }
  while( true ) {
    iVar1 = local_74;
    if (local_70._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_70._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    piVar3 = local_70._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_70._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_70._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar3 = local_70._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,piVar3 + -1);
    *pmVar2 = iVar1;
    std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&local_70);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_70);
  return iVar1;
}

Assistant:

int UnionFindSet::find_header(int val) {
        stack<int> s_stack;
        while (val != father_map[val]){
            s_stack.push(val);
            val = father_map[val];
        }

        while (!s_stack.empty()){
            father_map[s_stack.top()] = val;
            s_stack.pop();
        }

        return val;
    }